

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O3

void __thiscall
axl::sl::StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release
          (StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this)

{
  int32_t *piVar1;
  BufHdr *pBVar2;
  FreeFunc *pFVar3;
  
  pBVar2 = this->m_hdr;
  if (pBVar2 != (BufHdr *)0x0) {
    LOCK();
    piVar1 = &(pBVar2->super_RefCount).m_refCount;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(pBVar2->super_RefCount)._vptr_RefCount)(pBVar2);
      LOCK();
      piVar1 = &(pBVar2->super_RefCount).m_weakRefCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) &&
         (pFVar3 = (pBVar2->super_RefCount).m_freeFunc, pFVar3 != (FreeFunc *)0x0)) {
        (*pFVar3)(pBVar2);
      }
    }
  }
  *(undefined8 *)((long)&this->m_hdr + 1) = 0;
  *(undefined8 *)((long)&this->m_length + 1) = 0;
  this->m_p = (C *)0x0;
  this->m_hdr = (BufHdr *)0x0;
  return;
}

Assistant:

void
	release() {
		if (m_hdr)
			m_hdr->release();

		initialize();
	}